

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::DescriptorBuilder
          (DescriptorBuilder *this,DescriptorPool *pool,Tables *tables,
          DeferredValidation *deferred_validation,ErrorCollector *error_collector)

{
  int iVar1;
  FeatureSet *extendee;
  CppFeatures *prototype;
  allocator<char> local_45 [21];
  ErrorCollector *local_30;
  ErrorCollector *error_collector_local;
  DeferredValidation *deferred_validation_local;
  Tables *tables_local;
  DescriptorPool *pool_local;
  DescriptorBuilder *this_local;
  
  this->pool_ = pool;
  this->tables_ = tables;
  this->deferred_validation_ = deferred_validation;
  this->error_collector_ = error_collector;
  local_30 = error_collector;
  error_collector_local = (ErrorCollector *)deferred_validation;
  deferred_validation_local = (DeferredValidation *)tables;
  tables_local = (Tables *)pool;
  pool_local = (DescriptorPool *)this;
  std::optional<google::protobuf::FeatureResolver>::optional();
  std::
  vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
  ::vector(&this->options_to_interpret_);
  this->had_errors_ = false;
  std::__cxx11::string::string((string *)&this->filename_);
  absl::lts_20250127::
  flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::flat_hash_set(&this->dependencies_);
  absl::lts_20250127::
  flat_hash_map<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
  ::flat_hash_map(&this->message_hints_);
  absl::lts_20250127::
  flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::flat_hash_set(&this->unused_dependency_);
  this->possible_undeclared_dependency_ = (FileDescriptor *)0x0;
  std::__cxx11::string::string((string *)&this->possible_undeclared_dependency_name_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->undefine_resolved_name_,"",local_45);
  std::allocator<char>::~allocator(local_45);
  iVar1 = internal::cpp::MaxMessageDeclarationNestingDepth();
  this->recursion_depth_ = iVar1;
  if (DescriptorBuilder(google::protobuf::DescriptorPool_const*,google::protobuf::DescriptorPool::Tables*,google::protobuf::DescriptorPool::DeferredValidation&,google::protobuf::DescriptorPool::ErrorCollector*)
      ::lazy_register == '\0') {
    iVar1 = __cxa_guard_acquire(&DescriptorBuilder(google::protobuf::DescriptorPool_const*,google::protobuf::DescriptorPool::Tables*,google::protobuf::DescriptorPool::DeferredValidation&,google::protobuf::DescriptorPool::ErrorCollector*)
                                 ::lazy_register);
    if (iVar1 != 0) {
      extendee = FeatureSet::default_instance();
      iVar1 = internal::
              ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)'\v',_false>
              ::number((ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                        *)pb::cpp);
      prototype = pb::CppFeatures::default_instance();
      internal::ExtensionSet::RegisterMessageExtension
                ((MessageLite *)extendee,iVar1,'\v',false,false,(MessageLite *)prototype,
                 (LazyEagerVerifyFnType)0x0,kUndefined);
      __cxa_guard_release(&DescriptorBuilder(google::protobuf::DescriptorPool_const*,google::protobuf::DescriptorPool::Tables*,google::protobuf::DescriptorPool::DeferredValidation&,google::protobuf::DescriptorPool::ErrorCollector*)
                           ::lazy_register);
    }
  }
  return;
}

Assistant:

DescriptorBuilder::DescriptorBuilder(
    const DescriptorPool* pool, DescriptorPool::Tables* tables,
    DescriptorPool::DeferredValidation& deferred_validation,
    DescriptorPool::ErrorCollector* error_collector)
    : pool_(pool),
      tables_(tables),
      deferred_validation_(deferred_validation),
      error_collector_(error_collector),
      had_errors_(false),
      possible_undeclared_dependency_(nullptr),
      undefine_resolved_name_("") {
  // Ensure that any lazily loaded static initializers from the generated pool
  // (e.g. from bootstrapped protos) are run before building any descriptors. We
  // have to avoid registering these pre-main, because we need to ensure that
  // the linker --gc-sections step can strip out the full runtime if it is
  // unused.
  [[maybe_unused]] static std::true_type lazy_register =
      (internal::ExtensionSet::RegisterMessageExtension(
           &FeatureSet::default_instance(), pb::cpp.number(),
           FieldDescriptor::TYPE_MESSAGE, false, false,
           &pb::CppFeatures::default_instance(),
           nullptr,
           internal::LazyAnnotation::kUndefined),
       std::true_type{});
}